

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prodcons6.c
# Opt level: O1

void * consumer(void *arg)

{
  ulong uVar1;
  
  if (0 < nitems) {
    uVar1 = 0;
    do {
      pthread_mutex_lock((pthread_mutex_t *)&ready);
      while (ready.nready == 0) {
        pthread_cond_wait((pthread_cond_t *)&ready.cond,(pthread_mutex_t *)&ready);
      }
      ready.nready = ready.nready + -1;
      pthread_mutex_unlock((pthread_mutex_t *)&ready);
      if (uVar1 != (uint)buf[uVar1]) {
        consumer_cold_1();
      }
      uVar1 = uVar1 + 1;
    } while ((long)uVar1 < (long)nitems);
  }
  puts("consumer finished!");
  return (void *)0x0;
}

Assistant:

void *consumer(void *arg) {
    int i;
    for (i = 0; i < nitems; ++i) {
        pthread_mutex_lock(&ready.mutex);
        while (ready.nready == 0) {
            pthread_cond_wait(&ready.cond, &ready.mutex);
        }
        ready.nready--;
        pthread_mutex_unlock(&ready.mutex);
        ASSERT_ERR_SYS(i == buf[i], "buf[%d] = %d", i, buf[i]);
    }
    printf("consumer finished!\n");
    return NULL;
}